

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_font_multiline.cpp
# Opt level: O0

bool draw_custom_multiline_cb(int line_num,char *line,int size,void *extra)

{
  undefined8 uVar1;
  double dVar2;
  undefined8 uVar3;
  undefined8 *in_RCX;
  int in_EDX;
  undefined8 in_RSI;
  int in_EDI;
  undefined4 uVar4;
  float fVar5;
  float fVar6;
  undefined8 uVar7;
  ALLEGRO_COLOR c;
  ALLEGRO_USTR_INFO info;
  float y;
  float x;
  DRAW_CUSTOM_LINE_EXTRA *s;
  undefined1 local_40 [16];
  float local_30;
  float local_2c;
  undefined8 *local_28;
  int local_14;
  undefined8 local_10;
  int local_4;
  
  local_28 = in_RCX;
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_4 = in_EDI;
  dVar2 = fmod(((double)in_EDI * 360.0) / 5.0 + (double)*(int *)(in_RCX + 2),360.0);
  uVar7 = 0x3f800000;
  uVar4 = al_color_hsv((float)dVar2);
  fVar5 = *(float *)(local_28 + 1);
  dVar2 = sin((double)*(int *)(local_28 + 2) * 0.05 + (double)local_4);
  fVar5 = (float)(dVar2 * 10.0 + (double)(fVar5 + 10.0));
  fVar6 = *(float *)((long)local_28 + 0x14) * (float)local_4 + *(float *)((long)local_28 + 0xc);
  uVar1 = *local_28;
  local_30 = fVar6;
  local_2c = fVar5;
  uVar3 = al_ref_buffer(local_40,local_10,(long)local_14);
  al_draw_ustr(uVar4,uVar7,fVar5,fVar6,uVar1,0,uVar3);
  return local_4 < 5;
}

Assistant:

static bool draw_custom_multiline_cb(int line_num, const char *line, int size,
   void *extra) {
   DRAW_CUSTOM_LINE_EXTRA *s = (DRAW_CUSTOM_LINE_EXTRA *) extra;
   float x, y;
   ALLEGRO_USTR_INFO info;
   ALLEGRO_COLOR c =
      al_color_hsv(fmod(360.0 * (float)line_num / 5.0 + s->tick, 360.0),
                   1.0, 1.0);
   x  = s->x + 10 + sin(line_num + s->tick * 0.05) * 10;
   y  = s->y + (s->line_height * line_num);
   al_draw_ustr(s->font, c, x, y, 0, al_ref_buffer(&info, line, size));
   return (line_num < 5);
}